

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O1

bool __thiscall HawkTracer::client::TracepointMap::load_map(TracepointMap *this,string *map_file)

{
  char cVar1;
  istream *piVar2;
  mapped_type *this_00;
  string category;
  string label_str;
  uint64_t label;
  ifstream file;
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  key_type local_240;
  string local_238 [520];
  
  std::ifstream::ifstream(local_238);
  std::ifstream::open(local_238,(_Ios_Openmode)map_file);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_2a0 = local_290;
    local_298 = 0;
    local_290[0] = 0;
    local_2c0 = local_2b0;
    local_2b8 = 0;
    local_2b0[0] = 0;
    while( true ) {
      piVar2 = std::operator>>((istream *)local_238,(string *)&local_2c0);
      piVar2 = std::operator>>(piVar2,(string *)&local_2a0);
      piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_280[0] = local_270;
      std::__cxx11::string::_M_construct<char*>((string *)local_280,local_2a0,local_2a0 + local_298)
      ;
      local_260[0] = local_250;
      std::__cxx11::string::_M_construct<char*>((string *)local_260,local_2c0,local_2c0 + local_2b8)
      ;
      this_00 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,&local_240);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_280);
      std::__cxx11::string::operator=((string *)&this_00->category,(string *)local_260);
      if (local_260[0] != local_250) {
        operator_delete(local_260[0]);
      }
      if (local_280[0] != local_270) {
        operator_delete(local_280[0]);
      }
    }
    if (local_2c0 != local_2b0) {
      operator_delete(local_2c0);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0);
    }
  }
  std::ifstream::~ifstream(local_238);
  return (bool)cVar1;
}

Assistant:

bool TracepointMap::load_map(const std::string& map_file)
{
    std::ifstream file;
    file.open(map_file);

    if (!file.is_open())
    {
        return false;
    }

    std::string label_str;
    uint64_t label;
    std::string category;
    while (file >> category >> label_str >> label)
    {
        _input_map[label] = MapInfo{ label_str, category };
    }

    return true;
}